

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall cmCTest::GetInitializedHandler(cmCTest *this,char *handler)

{
  iterator iVar1;
  cmCTestGenericHandler *pcVar2;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,handler,&local_39);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
          ::find(&(this->TestingHandlers)._M_t,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = (cmCTestGenericHandler *)0x0;
  }
  else {
    (**(code **)(**(long **)(iVar1._M_node + 2) + 0x18))();
    pcVar2 = *(cmCTestGenericHandler **)(iVar1._M_node + 2);
  }
  return pcVar2;
}

Assistant:

cmCTestGenericHandler* cmCTest::GetInitializedHandler(const char* handler)
{
  cmCTest::t_TestingHandlers::iterator it =
    this->TestingHandlers.find(handler);
  if (it == this->TestingHandlers.end()) {
    return CM_NULLPTR;
  }
  it->second->Initialize();
  return it->second;
}